

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts3EvalNextRow(Fts3Cursor *pCsr,Fts3Expr *pExpr,int *pRc)

{
  char *pcVar1;
  Fts3Expr *pFVar2;
  Fts3Expr *pFVar3;
  Fts3Table *pTab;
  sqlite3_int64 sVar4;
  u8 uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  char *__dest;
  ulong uVar9;
  Fts3Phrase *pFVar10;
  long extraout_RDX;
  long lVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  char **ppcVar15;
  Fts3Expr *pFVar16;
  int iVar17;
  ulong uVar18;
  TokenDoclist *p;
  bool bVar19;
  u8 uVar20;
  u8 local_111;
  Fts3Phrase *local_110;
  u8 local_101;
  Fts3Expr *local_100;
  ulong local_f8;
  int *local_f0;
  int local_e8;
  int local_e4;
  char *local_e0;
  u8 *local_d8;
  long local_d0;
  char *pR;
  char *pL;
  TokenDoclist a [4];
  
  if (*pRc != 0) {
    return;
  }
  uVar20 = pCsr->bDesc;
  pExpr->bStart = '\x01';
  local_100 = pExpr;
  switch(pExpr->eType) {
  case 1:
  case 3:
    pFVar2 = pExpr->pLeft;
    pFVar3 = pExpr->pRight;
    if (pFVar2->bDeferred == '\0') {
      uVar5 = pFVar3->bDeferred;
      fts3EvalNextRow(pCsr,pFVar2,pRc);
      pFVar16 = pFVar3;
      if (uVar5 == '\0') {
        while (fts3EvalNextRow(pCsr,pFVar16,pRc), pFVar2->bEof == '\0') {
          uVar5 = pFVar3->bEof;
          if (uVar5 != '\0') {
            lVar11 = pFVar2->iDocid;
LAB_001a7c67:
            local_100->iDocid = lVar11;
            bVar19 = uVar5 != '\0';
            goto LAB_001a7c75;
          }
          lVar11 = pFVar2->iDocid;
          if (*pRc != 0) goto LAB_001a7c67;
          lVar14 = lVar11 - pFVar3->iDocid;
          lVar7 = -lVar14;
          if (uVar20 == '\0') {
            lVar7 = lVar14;
          }
          if (lVar7 == 0) goto LAB_001a7c67;
          pFVar16 = pFVar2;
          if (-1 < lVar7) {
            pFVar16 = pFVar3;
          }
        }
        local_100->iDocid = pFVar2->iDocid;
        bVar19 = true;
LAB_001a7c75:
        local_100->bEof = bVar19;
        if ((local_100->eType == 1) && (bVar19 != false)) {
          pFVar10 = pFVar3->pPhrase;
          if ((pFVar10->doclist).aAll != (char *)0x0) {
            while ((*pRc == 0 && (pFVar3->bEof == '\0'))) {
              memset((pFVar10->doclist).pList,0,(long)(pFVar10->doclist).nList);
              fts3EvalNextRow(pCsr,pFVar3,pRc);
            }
          }
          pFVar10 = pFVar2->pPhrase;
          if ((pFVar10 != (Fts3Phrase *)0x0) && ((pFVar10->doclist).aAll != (char *)0x0)) {
            while ((*pRc == 0 && (pFVar2->bEof == '\0'))) {
              memset((pFVar10->doclist).pList,0,(long)(pFVar10->doclist).nList);
              fts3EvalNextRow(pCsr,pFVar2,pRc);
            }
          }
        }
      }
      else {
        local_100->iDocid = pFVar2->iDocid;
        local_100->bEof = pFVar2->bEof;
      }
    }
    else {
      fts3EvalNextRow(pCsr,pFVar3,pRc);
      pExpr->iDocid = pFVar3->iDocid;
      pExpr->bEof = pFVar3->bEof;
    }
    break;
  case 2:
    pFVar2 = pExpr->pLeft;
    pFVar3 = pExpr->pRight;
    if (pFVar3->bStart == '\0') {
      fts3EvalNextRow(pCsr,pFVar3,pRc);
    }
    fts3EvalNextRow(pCsr,pFVar2,pRc);
    uVar5 = pFVar2->bEof;
    if (uVar5 == '\0') {
      while ((*pRc == 0 && (pFVar3->bEof == '\0'))) {
        lVar7 = pFVar2->iDocid - pFVar3->iDocid;
        lVar11 = -lVar7;
        if (uVar20 == '\0') {
          lVar11 = lVar7;
        }
        if (lVar11 < 1) break;
        fts3EvalNextRow(pCsr,pFVar3,pRc);
      }
      uVar5 = pFVar2->bEof;
    }
    pExpr->iDocid = pFVar2->iDocid;
    pExpr->bEof = uVar5;
    break;
  case 4:
    pFVar2 = pExpr->pLeft;
    pFVar3 = pExpr->pRight;
    uVar18 = -(ulong)(uVar20 != '\0') | 1;
    pFVar16 = pFVar2;
    if (pFVar3->bEof == '\0') {
      lVar11 = (pFVar2->iDocid - pFVar3->iDocid) * uVar18;
      if (((pFVar2->bEof != '\0') || (-1 < lVar11)) &&
         ((pFVar16 = pFVar3, pFVar2->bEof == '\0' && (lVar11 < 1)))) {
        fts3EvalNextRow(pCsr,pFVar2,pRc);
      }
    }
    fts3EvalNextRow(pCsr,pFVar16,pRc);
    if (pFVar2->bEof == '\0') {
      bVar19 = false;
    }
    else {
      bVar19 = pFVar3->bEof != '\0';
    }
    local_100->bEof = bVar19;
    if ((pFVar3->bEof == '\0') &&
       ((pFVar2->bEof != '\0' || (-1 < (long)((pFVar2->iDocid - pFVar3->iDocid) * uVar18))))) {
      local_100->iDocid = pFVar3->iDocid;
    }
    else {
      local_100->iDocid = pFVar2->iDocid;
    }
    break;
  default:
    pFVar10 = pExpr->pPhrase;
    local_f0 = pRc;
    fts3EvalInvalidatePoslist(pFVar10);
    local_d8 = &pExpr->bEof;
    pTab = (Fts3Table *)(pCsr->base).pVtab;
    local_110 = pFVar10;
    if (pFVar10->bIncr == 0) {
      if ((pCsr->bDesc == pTab->bDescIdx) || (iVar6 = (pFVar10->doclist).nAll, iVar6 == 0)) {
        fts3EvalDlPhraseNext(pTab,&pFVar10->doclist,local_d8);
      }
      else {
        sqlite3Fts3DoclistPrev
                  ((uint)pTab->bDescIdx,(pFVar10->doclist).aAll,iVar6,&(pFVar10->doclist).pNextDocid
                   ,&(pFVar10->doclist).iDocid,&(pFVar10->doclist).nList,local_d8);
        (local_110->doclist).pList = (local_110->doclist).pNextDocid;
      }
      iVar6 = 0;
    }
    else {
      local_111 = '\0';
      if (pFVar10->nToken == 1) {
        iVar6 = sqlite3Fts3MsrIncrNext
                          (pTab,pFVar10->aToken[0].pSegcsr,&(pFVar10->doclist).iDocid,
                           &(pFVar10->doclist).pList,&(pFVar10->doclist).nList);
        uVar20 = (local_110->doclist).pList == (char *)0x0;
      }
      else {
        local_101 = pCsr->bDesc;
        a[3].pList = (char *)0x0;
        a[3].nList = 0;
        a[3]._28_4_ = 0;
        a[3].bIgnore = 0;
        a[3]._4_4_ = 0;
        a[3].iDocid = 0;
        a[2].pList = (char *)0x0;
        a[2].nList = 0;
        a[2]._28_4_ = 0;
        a[2].bIgnore = 0;
        a[2]._4_4_ = 0;
        a[2].iDocid = 0;
        a[1].pList = (char *)0x0;
        a[1].nList = 0;
        a[1]._28_4_ = 0;
        a[1].bIgnore = 0;
        a[1]._4_4_ = 0;
        a[1].iDocid = 0;
        a[0].pList = (char *)0x0;
        a[0].nList = 0;
        a[0]._28_4_ = 0;
        a[0].bIgnore = 0;
        a[0]._4_4_ = 0;
        a[0].iDocid = 0;
        uVar18 = -(ulong)(local_101 != '\0') | 1;
        iVar6 = 0;
        lVar11 = 0;
        while (p = a, (char)lVar11 == '\0') {
          lVar14 = 0;
          local_f8 = local_f8 & 0xffffffff00000000;
          lVar7 = 0;
          while (((iVar6 == 0 && (lVar14 < pFVar10->nToken)) && (local_111 == '\0'))) {
            iVar6 = incrPhraseTokenNext(pTab,pFVar10,(int)lVar14,p,&local_111);
            lVar11 = extraout_RDX;
            lVar8 = lVar7;
            if (p->bIgnore == 0) {
              lVar8 = p->iDocid;
              if ((int)local_f8 != 0) {
                lVar11 = -(lVar7 - lVar8);
                if (local_101 == '\0') {
                  lVar11 = lVar7 - lVar8;
                }
                if (-1 < lVar11) {
                  lVar8 = lVar7;
                }
              }
              local_f8 = CONCAT44(local_f8._4_4_,1);
            }
            lVar14 = lVar14 + 1;
            p = p + 1;
            pFVar10 = local_110;
            lVar7 = lVar8;
          }
          iVar13 = 0;
          while (sVar4 = lVar7, iVar13 < pFVar10->nToken) {
            while (((iVar17 = iVar13, lVar7 = sVar4, iVar6 == 0 && (local_111 == '\0')) &&
                   ((a[iVar17].bIgnore == 0 && ((long)((a[iVar17].iDocid - lVar7) * uVar18) < 0)))))
            {
              iVar6 = incrPhraseTokenNext(pTab,pFVar10,iVar17,a + iVar17,&local_111);
              lVar11 = (a[iVar17].iDocid - lVar7) * uVar18;
              pFVar10 = local_110;
              sVar4 = a[iVar17].iDocid;
              iVar13 = 0;
              if (lVar11 < 1) {
                sVar4 = lVar7;
                iVar13 = iVar17;
              }
            }
            iVar13 = iVar17 + 1;
          }
          lVar11 = CONCAT71((int7)((ulong)lVar11 >> 8),local_111);
          if (local_111 == '\0') {
            iVar13 = a[(long)pFVar10->nToken + -1].nList;
            local_d0 = lVar11;
            __dest = (char *)sqlite3_malloc(iVar13 + 8);
            if (__dest == (char *)0x0) {
              iVar6 = 7;
              goto LAB_001a7d36;
            }
            memcpy(__dest,(&pR)[(long)local_110->nToken * 4],(long)iVar13 + 1);
            pcVar1 = __dest + iVar13;
            pcVar1[0] = '\0';
            pcVar1[1] = '\0';
            pcVar1[2] = '\0';
            pcVar1[3] = '\0';
            pcVar1[4] = '\0';
            pcVar1[5] = '\0';
            pcVar1[6] = '\0';
            pcVar1[7] = '\0';
            uVar12 = 0;
            iVar13 = -1;
            ppcVar15 = &a[0].pList;
            iVar17 = 0;
            pFVar10 = local_110;
            while( true ) {
              uVar9 = (long)pFVar10->nToken - 1;
              if ((long)uVar9 <= (long)uVar12) break;
              if (((TokenDoclist *)(ppcVar15 + -2))->bIgnore == 0) {
                pL = *ppcVar15;
                local_f8 = uVar12;
                local_e8 = iVar17;
                local_e4 = iVar13;
                local_e0 = __dest;
                pR = __dest;
                iVar13 = fts3PoslistPhraseMerge(&local_e0,pFVar10->nToken + iVar13,0,1,&pL,&pR);
                pFVar10 = local_110;
                uVar12 = local_f8;
                if (iVar13 == 0) {
                  uVar9 = (ulong)(local_110->nToken - 1);
                  iVar17 = local_e8;
                  break;
                }
                iVar17 = (int)local_e0 - (int)__dest;
                iVar13 = local_e4;
              }
              uVar12 = uVar12 + 1;
              ppcVar15 = ppcVar15 + 4;
              iVar13 = iVar13 + -1;
            }
            if ((int)uVar9 == (int)uVar12) {
              (pFVar10->doclist).iDocid = lVar7;
              (pFVar10->doclist).pList = __dest;
              (pFVar10->doclist).nList = iVar17;
              (pFVar10->doclist).bFreeList = 1;
              lVar11 = 0;
              break;
            }
            sqlite3_free(__dest);
            pFVar10 = local_110;
            lVar11 = local_d0;
          }
        }
        uVar20 = (u8)lVar11;
        local_110 = pFVar10;
      }
      *local_d8 = uVar20;
    }
LAB_001a7d36:
    *local_f0 = iVar6;
    local_100->iDocid = (local_110->doclist).iDocid;
  }
  return;
}

Assistant:

static void fts3EvalNextRow(
  Fts3Cursor *pCsr,               /* FTS Cursor handle */
  Fts3Expr *pExpr,                /* Expr. to advance to next matching row */
  int *pRc                        /* IN/OUT: Error code */
){
  if( *pRc==SQLITE_OK ){
    int bDescDoclist = pCsr->bDesc;         /* Used by DOCID_CMP() macro */
    assert( pExpr->bEof==0 );
    pExpr->bStart = 1;

    switch( pExpr->eType ){
      case FTSQUERY_NEAR:
      case FTSQUERY_AND: {
        Fts3Expr *pLeft = pExpr->pLeft;
        Fts3Expr *pRight = pExpr->pRight;
        assert( !pLeft->bDeferred || !pRight->bDeferred );

        if( pLeft->bDeferred ){
          /* LHS is entirely deferred. So we assume it matches every row.
          ** Advance the RHS iterator to find the next row visited. */
          fts3EvalNextRow(pCsr, pRight, pRc);
          pExpr->iDocid = pRight->iDocid;
          pExpr->bEof = pRight->bEof;
        }else if( pRight->bDeferred ){
          /* RHS is entirely deferred. So we assume it matches every row.
          ** Advance the LHS iterator to find the next row visited. */
          fts3EvalNextRow(pCsr, pLeft, pRc);
          pExpr->iDocid = pLeft->iDocid;
          pExpr->bEof = pLeft->bEof;
        }else{
          /* Neither the RHS or LHS are deferred. */
          fts3EvalNextRow(pCsr, pLeft, pRc);
          fts3EvalNextRow(pCsr, pRight, pRc);
          while( !pLeft->bEof && !pRight->bEof && *pRc==SQLITE_OK ){
            sqlite3_int64 iDiff = DOCID_CMP(pLeft->iDocid, pRight->iDocid);
            if( iDiff==0 ) break;
            if( iDiff<0 ){
              fts3EvalNextRow(pCsr, pLeft, pRc);
            }else{
              fts3EvalNextRow(pCsr, pRight, pRc);
            }
          }
          pExpr->iDocid = pLeft->iDocid;
          pExpr->bEof = (pLeft->bEof || pRight->bEof);
          if( pExpr->eType==FTSQUERY_NEAR && pExpr->bEof ){
            assert( pRight->eType==FTSQUERY_PHRASE );
            if( pRight->pPhrase->doclist.aAll ){
              Fts3Doclist *pDl = &pRight->pPhrase->doclist;
              while( *pRc==SQLITE_OK && pRight->bEof==0 ){
                memset(pDl->pList, 0, pDl->nList);
                fts3EvalNextRow(pCsr, pRight, pRc);
              }
            }
            if( pLeft->pPhrase && pLeft->pPhrase->doclist.aAll ){
              Fts3Doclist *pDl = &pLeft->pPhrase->doclist;
              while( *pRc==SQLITE_OK && pLeft->bEof==0 ){
                memset(pDl->pList, 0, pDl->nList);
                fts3EvalNextRow(pCsr, pLeft, pRc);
              }
            }
          }
        }
        break;
      }
  
      case FTSQUERY_OR: {
        Fts3Expr *pLeft = pExpr->pLeft;
        Fts3Expr *pRight = pExpr->pRight;
        sqlite3_int64 iCmp = DOCID_CMP(pLeft->iDocid, pRight->iDocid);

        assert( pLeft->bStart || pLeft->iDocid==pRight->iDocid );
        assert( pRight->bStart || pLeft->iDocid==pRight->iDocid );

        if( pRight->bEof || (pLeft->bEof==0 && iCmp<0) ){
          fts3EvalNextRow(pCsr, pLeft, pRc);
        }else if( pLeft->bEof || iCmp>0 ){
          fts3EvalNextRow(pCsr, pRight, pRc);
        }else{
          fts3EvalNextRow(pCsr, pLeft, pRc);
          fts3EvalNextRow(pCsr, pRight, pRc);
        }

        pExpr->bEof = (pLeft->bEof && pRight->bEof);
        iCmp = DOCID_CMP(pLeft->iDocid, pRight->iDocid);
        if( pRight->bEof || (pLeft->bEof==0 &&  iCmp<0) ){
          pExpr->iDocid = pLeft->iDocid;
        }else{
          pExpr->iDocid = pRight->iDocid;
        }

        break;
      }

      case FTSQUERY_NOT: {
        Fts3Expr *pLeft = pExpr->pLeft;
        Fts3Expr *pRight = pExpr->pRight;

        if( pRight->bStart==0 ){
          fts3EvalNextRow(pCsr, pRight, pRc);
          assert( *pRc!=SQLITE_OK || pRight->bStart );
        }

        fts3EvalNextRow(pCsr, pLeft, pRc);
        if( pLeft->bEof==0 ){
          while( !*pRc 
              && !pRight->bEof 
              && DOCID_CMP(pLeft->iDocid, pRight->iDocid)>0 
          ){
            fts3EvalNextRow(pCsr, pRight, pRc);
          }
        }
        pExpr->iDocid = pLeft->iDocid;
        pExpr->bEof = pLeft->bEof;
        break;
      }

      default: {
        Fts3Phrase *pPhrase = pExpr->pPhrase;
        fts3EvalInvalidatePoslist(pPhrase);
        *pRc = fts3EvalPhraseNext(pCsr, pPhrase, &pExpr->bEof);
        pExpr->iDocid = pPhrase->doclist.iDocid;
        break;
      }
    }
  }
}